

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

void JsrtDebugUtils::AddVarPropertyToObject
               (DynamicObject *object,char16 *propertyName,Var value,ScriptContext *scriptContext)

{
  char16 *instance;
  PropertyId propertyId;
  size_t sVar1;
  Var newValue;
  Var marshaledObj;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext_local;
  Var value_local;
  char16 *propertyName_local;
  DynamicObject *object_local;
  
  propertyRecord = (PropertyRecord *)scriptContext;
  scriptContext_local = (ScriptContext *)value;
  value_local = propertyName;
  propertyName_local = (char16 *)object;
  sVar1 = PAL_wcslen(propertyName);
  Js::ScriptContext::GetOrAddPropertyRecord
            (scriptContext,propertyName,(int)sVar1,(PropertyRecord **)&marshaledObj);
  newValue = Js::CrossSite::MarshalVar((ScriptContext *)propertyRecord,scriptContext_local,false);
  instance = propertyName_local;
  propertyId = Js::PropertyRecord::GetPropertyId((PropertyRecord *)marshaledObj);
  Js::JavascriptOperators::InitProperty
            ((RecyclableObject *)instance,propertyId,newValue,PropertyOperation_None);
  return;
}

Assistant:

void JsrtDebugUtils::AddVarPropertyToObject(Js::DynamicObject * object, const char16 * propertyName, Js::Var value, Js::ScriptContext * scriptContext)
{
    const Js::PropertyRecord* propertyRecord;

    // propertyName is the DEBUGOBJECTPROPERTY from JsrtDebugPropertiesEnum so it can't have embedded null, ok to use wcslen
    scriptContext->GetOrAddPropertyRecord(propertyName, static_cast<int>(wcslen(propertyName)), &propertyRecord);

    Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, value);

    if (FALSE == Js::JavascriptOperators::InitProperty(object, propertyRecord->GetPropertyId(), marshaledObj))
    {
        Assert("Failed to add property to debugger object");
    }
}